

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::AllOptions::AllOptions(AllOptions *this)

{
  (this->m_parsers).
  super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_parsers).
  super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_parsers).
  super__Vector_base<Catch::Ptr<Catch::OptionParser>,_std::allocator<Catch::Ptr<Catch::OptionParser>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  add<Catch::Options::TestCaseOptionParser>(this);
  add<Catch::Options::TagOptionParser>(this);
  add<Catch::Options::ListOptionParser>(this);
  add<Catch::Options::ReporterOptionParser>(this);
  add<Catch::Options::OutputOptionParser>(this);
  add<Catch::Options::SuccessOptionParser>(this);
  add<Catch::Options::DebugBreakOptionParser>(this);
  add<Catch::Options::NameOptionParser>(this);
  add<Catch::Options::AbortOptionParser>(this);
  add<Catch::Options::NoThrowOptionParser>(this);
  add<Catch::Options::WarningsOptionParser>(this);
  add<Catch::Options::HelpOptionParser>(this);
  return;
}

Assistant:

AllOptions() {
            add<Options::TestCaseOptionParser>();   // Keep this one first

            add<Options::TagOptionParser>();
            add<Options::ListOptionParser>();
            add<Options::ReporterOptionParser>();
            add<Options::OutputOptionParser>();
            add<Options::SuccessOptionParser>();
            add<Options::DebugBreakOptionParser>();
            add<Options::NameOptionParser>();
            add<Options::AbortOptionParser>();
            add<Options::NoThrowOptionParser>();
            add<Options::WarningsOptionParser>();

            add<Options::HelpOptionParser>();       // Keep this one last
        }